

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

log_entry * __thiscall log_queue::pop_top(log_queue *this)

{
  size_type sVar1;
  reference pplVar2;
  bool bVar3;
  log_entry *top;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  log_queue *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->queue_mutex);
  while( true ) {
    sVar1 = std::
            queue<log_queue::log_entry_*,_std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>_>
            ::size(&this->queue);
    bVar3 = false;
    if (sVar1 == 0) {
      bVar3 = (this->active & 1U) == 1;
    }
    if (!bVar3) break;
    std::condition_variable::wait((unique_lock *)&this->wait_for_next_item_condition);
  }
  if ((this->active & 1U) == 0) {
    this_local = (log_queue *)0x0;
  }
  else {
    pplVar2 = std::
              queue<log_queue::log_entry_*,_std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>_>
              ::front(&this->queue);
    this_local = (log_queue *)*pplVar2;
    std::
    queue<log_queue::log_entry_*,_std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>_>
    ::pop(&this->queue);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return (log_entry *)this_local;
}

Assistant:

log_entry* pop_top() {
            std::unique_lock<std::mutex> lock(queue_mutex);
            while ((queue.size() == 0) && (active == true)) {
                wait_for_next_item_condition.wait(lock);
            }

            if (!active) {
                return nullptr;
            }

            log_entry* top = queue.front();
            queue.pop();
            return top;
        }